

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

ON_XMLNode * FindPostEffectNodeForId(ON_XMLNode *pep_section_node,ON_UUID *id)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  ON_UUID_struct OVar4;
  ON_UUID_struct local_60;
  long *local_50;
  ON_XMLProperty *prop;
  ON_XMLNode *local_38;
  ON_XMLNode *pep_node;
  ChildIterator it;
  ON_UUID *id_local;
  ON_XMLNode *pep_section_node_local;
  
  it._private = (ON_XMLNodeChildIteratorPrivate *)id;
  (*pep_section_node->_vptr_ON_XMLNode[0x2c])();
  local_38 = ON_XMLNode::ChildIterator::GetNextChild((ChildIterator *)&pep_node);
  do {
    if (local_38 == (ON_XMLNode *)0x0) {
      pep_section_node_local = (ON_XMLNode *)0x0;
LAB_0080e814:
      ON_XMLNode::ChildIterator::~ChildIterator((ChildIterator *)&pep_node);
      return pep_section_node_local;
    }
    iVar2 = (*local_38->_vptr_ON_XMLNode[0x26])(local_38,L"id");
    local_50 = (long *)CONCAT44(extraout_var,iVar2);
    if (local_50 != (long *)0x0) {
      plVar3 = (long *)(**(code **)(*local_50 + 0x38))();
      OVar4 = (ON_UUID_struct)(**(code **)(*plVar3 + 0x138))();
      local_60 = OVar4;
      bVar1 = operator==(&local_60,(ON_UUID_struct *)it._private);
      if (bVar1) {
        pep_section_node_local = local_38;
        goto LAB_0080e814;
      }
    }
    local_38 = ON_XMLNode::ChildIterator::GetNextChild((ChildIterator *)&pep_node);
  } while( true );
}

Assistant:

ON_XMLNode* FindPostEffectNodeForId(const ON_XMLNode& pep_section_node, const ON_UUID& id)
{
  auto it = pep_section_node.GetChildIterator();

  auto* pep_node = it.GetNextChild();
  while (nullptr != pep_node)
  {
    const auto* prop = pep_node->GetNamedProperty(ON_RDK_PEP_ID);
    if (nullptr != prop)
    {
      if (prop->GetValue().AsUuid() == id)
        return pep_node;
    }

    pep_node = it.GetNextChild();
  }

  return nullptr;
}